

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ERK.cpp
# Opt level: O0

void __thiscall RK8::Integrate(RK8 *this)

{
  double t;
  double h;
  clock_t cVar1;
  Mat local_70 [2];
  Mat local_50;
  undefined1 local_40 [8];
  Mat input;
  int i;
  clock_t local_18;
  clock_t t1;
  RK8 *this_local;
  
  t1 = (clock_t)this;
  local_18 = clock();
  *(undefined8 *)(this + 0x28) = *(undefined8 *)(this + 0x40);
  Mat::operator=((Mat *)&stack0xffffffffffffffd8,(Mat *)(this + 0x10));
  Mat::~Mat((Mat *)&stack0xffffffffffffffd8);
  for (input.v_._4_4_ = 0;
      (double)input.v_._4_4_ <
      (*(double *)(this + 0x48) - *(double *)(this + 0x40)) / *(double *)(this + 0x60);
      input.v_._4_4_ = input.v_._4_4_ + 1) {
    Mat::GetCol((Mat *)local_40,(int)this + 0x68);
    t = *(double *)(this + 0x28);
    Mat::Mat(&local_50,(Mat *)(this + 0x10));
    h = *(double *)(this + 0x60);
    Mat::Mat(local_70,(Mat *)local_40);
    Step(this,t,&local_50,h,local_70);
    Mat::~Mat(local_70);
    Mat::~Mat(&local_50);
    Mat::~Mat((Mat *)local_40);
  }
  cVar1 = clock();
  *(double *)(this + 0x20) = (double)(cVar1 - local_18) + *(double *)(this + 0x20);
  return;
}

Assistant:

void RK8::Integrate()
{
	clock_t t1 = clock();
	t_out_ = t_initial_;
	y_out_ = y_0_;
	for (int i = 0; i < (t_final_ - t_initial_) / h_; i++)
	{
		Mat input = u_vec_.GetCol(i);
		Step(t_out_, y_out_, h_, input);
	}
	time_ += (clock() - t1);
}